

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O2

void __thiscall
llvm::ScopedPrinter::printHex<unsigned_short>
          (ScopedPrinter *this,StringRef Label,unsigned_short Value)

{
  raw_ostream *prVar1;
  undefined6 in_register_0000000a;
  HexNumber local_28;
  
  prVar1 = startLine(this);
  prVar1 = raw_ostream::operator<<(prVar1,Label);
  prVar1 = raw_ostream::operator<<(prVar1,": ");
  local_28.Value = CONCAT62(in_register_0000000a,Value) & 0xffffffff;
  prVar1 = llvm::operator<<(prVar1,&local_28);
  raw_ostream::operator<<(prVar1,"\n");
  return;
}

Assistant:

void printHex(StringRef Label, T Value) {
    startLine() << Label << ": " << hex(Value) << "\n";
  }